

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintNumberUnsigned(_U_UINT number)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  
  uVar4 = 1;
  if (9 < number) {
    do {
      uVar4 = uVar4 * 10;
    } while (9 < number / uVar4);
  }
  do {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = number;
    putchar(SUB164(auVar3 / auVar2,0) + (int)(SUB168(auVar3 / auVar2,0) / 10) * -10 | 0x30);
    bVar1 = 9 < uVar4;
    uVar4 = uVar4 / 10;
  } while (bVar1);
  return;
}

Assistant:

void UnityPrintNumberUnsigned(const _U_UINT number)
{
    _U_UINT divisor = 1;

    /* figure out initial divisor */
    while (number / divisor > 9)
    {
        divisor *= 10;
    }

    /* now mod and print, then divide divisor */
    do
    {
        UNITY_OUTPUT_CHAR((char)('0' + (number / divisor % 10)));
        divisor /= 10;
    }
    while (divisor > 0);
}